

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O2

void __thiscall mjs::block_statement::print(block_statement *this,wostream *os)

{
  __uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_> _Var1;
  wostream *pwVar2;
  pointer puVar3;
  char *pcVar4;
  size_t i;
  ulong uVar5;
  
  pwVar2 = std::operator<<(os,"block_statement{");
  pcVar4 = "non-strict";
  if (this->strict_mode_ != false) {
    pcVar4 = "strict";
  }
  pwVar2 = std::operator<<(pwVar2,pcVar4);
  std::operator<<(pwVar2,", {");
  for (uVar5 = 0;
      puVar3 = (this->l_).
               super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(this->l_).
                            super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 3);
      uVar5 = uVar5 + 1) {
    if (uVar5 != 0) {
      std::operator<<(os,", ");
      puVar3 = (this->l_).
               super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    _Var1._M_t.super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
    super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl =
         puVar3[uVar5]._M_t.
         super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t;
    (**(code **)(*(long *)_Var1._M_t.
                          super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>
                          .super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl + 0x10))
              (_Var1._M_t.
               super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
               super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl,os);
  }
  std::operator<<(os,"}}");
  return;
}

Assistant:

void print(std::wostream& os) const override {
        os << "block_statement{" << (strict_mode_ ? "strict" : "non-strict") << ", {";
        for (size_t i = 0; i < l_.size(); ++i) {
            if (i) os << ", ";
            os << *l_[i];
        }
        os << "}}";
    }